

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void GlueFreeBlocks(CPpmd8 *p)

{
  Byte *pBVar1;
  int *piVar2;
  uint local_44;
  uint k;
  uint nu;
  CPpmd8_Node *node_1;
  CPpmd8_Node *node2;
  CPpmd8_Node *node;
  CPpmd8_Node_Ref next;
  uint i;
  CPpmd8_Node_Ref *prev;
  CPpmd8 *pCStack_10;
  CPpmd8_Node_Ref head;
  CPpmd8 *p_local;
  
  prev._4_4_ = 0;
  _next = (uint *)((long)&prev + 4);
  p->GlueCount = 0x2000;
  pCStack_10 = p;
  memset(p->Stamps,0,0x98);
  if (pCStack_10->LoUnit != pCStack_10->HiUnit) {
    pBVar1 = pCStack_10->LoUnit;
    pBVar1[0] = '\0';
    pBVar1[1] = '\0';
    pBVar1[2] = '\0';
    pBVar1[3] = '\0';
  }
  for (node._4_4_ = 0; node._4_4_ < 0x26; node._4_4_ = node._4_4_ + 1) {
    node._0_4_ = pCStack_10->FreeList[node._4_4_];
    pCStack_10->FreeList[node._4_4_] = 0;
    for (; (CPpmd_Void_Ref)node != 0;
        node._0_4_ = *(CPpmd_Void_Ref *)(pBVar1 + (ulong)(CPpmd_Void_Ref)node + 4)) {
      pBVar1 = pCStack_10->Base;
      if (*(int *)(pBVar1 + (ulong)(CPpmd_Void_Ref)node + 8) != 0) {
        *_next = (CPpmd_Void_Ref)node;
        _next = (uint *)(pBVar1 + (ulong)(CPpmd_Void_Ref)node + 4);
        while (piVar2 = (int *)(pBVar1 + (ulong)*(uint *)(pBVar1 + (ulong)(CPpmd_Void_Ref)node + 8)
                                         * 0xc + (ulong)(CPpmd_Void_Ref)node), *piVar2 == -1) {
          *(int *)(pBVar1 + (ulong)(CPpmd_Void_Ref)node + 8) =
               piVar2[2] + *(int *)(pBVar1 + (ulong)(CPpmd_Void_Ref)node + 8);
          piVar2[2] = 0;
        }
      }
    }
  }
  *_next = 0;
  while (prev._4_4_ != 0) {
    _k = pCStack_10->Base + prev._4_4_;
    prev._4_4_ = *(uint *)(_k + 4);
    local_44 = *(uint *)(_k + 8);
    if (local_44 != 0) {
      for (; 0x80 < local_44; local_44 = local_44 - 0x80) {
        InsertNode(pCStack_10,_k,0x25);
        _k = _k + 0x600;
      }
      node._4_4_ = (uint)pCStack_10->Units2Indx[local_44 - 1];
      if (pCStack_10->Indx2Units[node._4_4_] != local_44) {
        node._4_4_ = node._4_4_ - 1;
        InsertNode(pCStack_10,_k + (ulong)(uint)pCStack_10->Indx2Units[node._4_4_] * 0xc,
                   (local_44 - pCStack_10->Indx2Units[node._4_4_]) - 1);
      }
      InsertNode(pCStack_10,_k,node._4_4_);
    }
  }
  return;
}

Assistant:

static void GlueFreeBlocks(CPpmd7 *p)
{
  #ifdef PPMD_32BIT
  CPpmd7_Node headItem;
  CPpmd7_Node_Ref head = &headItem;
  #else
  CPpmd7_Node_Ref head = p->AlignOffset + p->Size;
  #endif
  
  CPpmd7_Node_Ref n = head;
  unsigned i;

  p->GlueCount = 255;

  /* create doubly-linked list of free blocks */
  for (i = 0; i < PPMD_NUM_INDEXES; i++)
  {
    UInt16 nu = I2U(i);
    CPpmd7_Node_Ref next = (CPpmd7_Node_Ref)p->FreeList[i];
    p->FreeList[i] = 0;
    while (next != 0)
    {
      CPpmd7_Node *node = NODE(next);
      node->Next = n;
      n = NODE(n)->Prev = next;
      next = *(const CPpmd7_Node_Ref *)node;
      node->Stamp = 0;
      node->NU = (UInt16)nu;
    }
  }
  NODE(head)->Stamp = 1;
  NODE(head)->Next = n;
  NODE(n)->Prev = head;
  if (p->LoUnit != p->HiUnit)
    ((CPpmd7_Node *)p->LoUnit)->Stamp = 1;
  
  /* Glue free blocks */
  while (n != head)
  {
    CPpmd7_Node *node = NODE(n);
    UInt32 nu = (UInt32)node->NU;
    for (;;)
    {
      CPpmd7_Node *node2 = NODE(n) + nu;
      nu += node2->NU;
      if (node2->Stamp != 0 || nu >= 0x10000)
        break;
      NODE(node2->Prev)->Next = node2->Next;
      NODE(node2->Next)->Prev = node2->Prev;
      node->NU = (UInt16)nu;
    }
    n = node->Next;
  }
  
  /* Fill lists of free blocks */
  for (n = NODE(head)->Next; n != head;)
  {
    CPpmd7_Node *node = NODE(n);
    unsigned nu;
    CPpmd7_Node_Ref next = node->Next;
    for (nu = node->NU; nu > 128; nu -= 128, node += 128)
      InsertNode(p, node, PPMD_NUM_INDEXES - 1);
    if (I2U(i = U2I(nu)) != nu)
    {
      unsigned k = I2U(--i);
      InsertNode(p, node + k, nu - k - 1);
    }
    InsertNode(p, node, i);
    n = next;
  }
}